

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O1

void __thiscall
HSimplexNla::setup(HSimplexNla *this,HighsLp *lp,HighsInt *basic_index,HighsOptions *options,
                  HighsTimer *timer,HighsSimplexAnalysis *analysis,
                  HighsSparseMatrix *factor_a_matrix,double factor_pivot_threshold)

{
  this->lp_ = lp;
  this->scale_ = (HighsScale *)0x0;
  if (((lp->scale_).has_scaling == true) && (lp->is_scaled_ == false)) {
    this->scale_ = &lp->scale_;
  }
  this->basic_index_ = basic_index;
  this->options_ = options;
  this->timer_ = timer;
  this->analysis_ = analysis;
  this->report_ = false;
  HFactor::setupGeneral
            (&this->factor_,lp->num_col_,lp->num_row_,lp->num_row_,
             (factor_a_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (factor_a_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (factor_a_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,basic_index,factor_pivot_threshold,
             (options->super_HighsOptionsStruct).factor_pivot_tolerance,
             (options->super_HighsOptionsStruct).highs_debug_level,
             &(options->super_HighsOptionsStruct).log_options,true,1);
  return;
}

Assistant:

void HSimplexNla::setup(const HighsLp* lp, HighsInt* basic_index,
                        const HighsOptions* options, HighsTimer* timer,
                        HighsSimplexAnalysis* analysis,
                        const HighsSparseMatrix* factor_a_matrix,
                        const double factor_pivot_threshold) {
  this->setLpAndScalePointers(lp);
  this->basic_index_ = basic_index;
  this->options_ = options;
  this->timer_ = timer;
  this->analysis_ = analysis;
  this->report_ = false;
  this->factor_.setupGeneral(
      this->lp_->num_col_, this->lp_->num_row_, this->lp_->num_row_,
      factor_a_matrix->start_.data(), factor_a_matrix->index_.data(),
      factor_a_matrix->value_.data(), this->basic_index_,
      factor_pivot_threshold, this->options_->factor_pivot_tolerance,
      this->options_->highs_debug_level, &(this->options_->log_options));
  assert(debugCheckData("After HSimplexNla::setup") == HighsDebugStatus::kOk);
}